

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_scalingFactorBetweenUnitsSameNameDifferentModels_Test::TestBody
          (Units_scalingFactorBetweenUnitsSameNameDifferentModels_Test *this)

{
  char *pcVar1;
  double local_a8;
  allocator<char> local_a0 [8];
  ModelPtr model2;
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr model1;
  AssertionResult gtest_ar;
  double scaling;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model2,"model1",(allocator<char> *)&u2);
  libcellml::Model::create((string *)&model1);
  std::__cxx11::string::~string((string *)&model2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model2,"units",(allocator<char> *)&u2);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)&model2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model2,"second",(allocator<char> *)&scaling);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&u2,"milli",(allocator<char> *)&local_a8);
  pcVar1 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"",local_a0);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model2,1.0,1.0,(string *)&u2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&u2);
  std::__cxx11::string::~string((string *)&model2);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::clone();
  libcellml::Model::units((ulong)&u2);
  scaling = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  local_a8 = 1.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","scaling",&local_a8,&scaling);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa46,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenUnitsSameNameDifferentModels)
{
    auto model1 = libcellml::Model::create("model1");
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("second", "milli");
    model1->addUnits(u1);

    auto model2 = model1->clone();
    auto u2 = model2->units(0);

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(1.0, scaling);
}